

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cpp
# Opt level: O0

int ncnn::rnn(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
             Mat *hidden_state,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long *in_RCX;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  long *in_R8;
  long *in_R9;
  float fVar5;
  long *in_stack_00000008;
  long in_stack_00000010;
  float H_1;
  int q_1;
  float *output_data;
  int i_1;
  int i;
  float H;
  float *weight_hc_ptr;
  float *weight_xc_ptr;
  int q;
  float *x;
  int ti;
  int t;
  Mat gates;
  int num_output;
  int T;
  int size;
  undefined4 in_stack_fffffffffffffdf8;
  int iVar6;
  undefined4 in_stack_fffffffffffffdfc;
  undefined8 in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  int local_1e4;
  int local_1d4;
  int local_1d0;
  float local_1cc;
  int local_1b4;
  int local_1a4;
  void *local_190;
  int *local_188;
  undefined8 local_180;
  undefined4 local_178;
  long *local_170;
  undefined4 local_168;
  undefined4 local_164;
  undefined4 local_160;
  undefined4 local_15c;
  int local_158;
  long local_150;
  int local_144;
  int local_140;
  int local_13c;
  long *local_138;
  long *local_130;
  long *local_128;
  int local_11c;
  long *local_118;
  long *local_110;
  int local_104;
  void **local_100;
  void **local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  int local_d4;
  void **local_d0;
  int local_c4;
  long *local_c0;
  int local_b4;
  long *local_b0;
  int local_a4;
  long *local_a0;
  int local_94;
  int local_78;
  undefined4 local_74;
  void **local_70;
  void *local_68;
  void **local_58;
  long local_50;
  long local_40;
  void **local_38;
  long local_30;
  void **local_28;
  long local_20;
  long local_10;
  long *local_8;
  
  local_13c = *(int *)((long)in_RDI + 0x2c);
  local_140 = (int)in_RDI[6];
  local_144 = *(int *)((long)in_RSI + 0x2c);
  local_e8 = *(undefined8 *)(in_stack_00000010 + 0x10);
  local_d0 = &local_190;
  local_e0 = 4;
  local_190 = (void *)0x0;
  local_188 = (int *)0x0;
  local_180 = 0;
  local_178 = 0;
  local_170 = (long *)0x0;
  local_168 = 0;
  local_164 = 0;
  local_160 = 0;
  local_15c = 0;
  local_158 = 0;
  local_150 = 0;
  local_138 = in_R9;
  local_130 = in_R8;
  local_128 = in_RCX;
  local_11c = in_EDX;
  local_118 = in_RSI;
  local_110 = in_RDI;
  local_d4 = local_144;
  Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
              (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),(size_t)local_d0,
              (Allocator *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  local_f0 = &local_190;
  if (local_190 != (void *)0x0) {
    local_58 = local_f0;
  }
  if (local_190 != (void *)0x0 && local_150 * local_158 != 0) {
    for (local_1a4 = 0; local_1a4 < local_140; local_1a4 = local_1a4 + 1) {
      iVar6 = local_1a4;
      if (local_11c != 0) {
        iVar6 = (local_140 + -1) - local_1a4;
      }
      local_a0 = local_110;
      lVar3 = *local_110;
      iVar2 = *(int *)((long)local_110 + 0x2c);
      lVar4 = local_110[2];
      local_a4 = iVar6;
      for (local_1b4 = 0; local_1b4 < local_144; local_1b4 = local_1b4 + 1) {
        local_b0 = local_128;
        local_b4 = local_1b4;
        local_c0 = local_138;
        local_c4 = local_1b4;
        local_10 = (long)local_1b4;
        local_8 = local_130;
        local_1cc = *(float *)(*local_130 + local_10 * 4);
        for (local_1d0 = 0; local_1d0 < local_13c; local_1d0 = local_1d0 + 1) {
          local_1cc = *(float *)(*local_128 +
                                 (long)*(int *)((long)local_128 + 0x2c) * (long)local_1b4 *
                                 local_128[2] + (long)local_1d0 * 4) *
                      *(float *)(lVar3 + (long)iVar2 * (long)iVar6 * lVar4 + (long)local_1d0 * 4) +
                      local_1cc;
        }
        for (local_1d4 = 0; local_1d4 < local_144; local_1d4 = local_1d4 + 1) {
          local_20 = (long)local_1d4;
          local_1cc = *(float *)(*local_138 +
                                 (long)*(int *)((long)local_138 + 0x2c) * (long)local_1b4 *
                                 local_138[2] + (long)local_1d4 * 4) *
                      *(float *)(*in_stack_00000008 + local_20 * 4) + local_1cc;
        }
        fVar5 = tanhf(local_1cc);
        local_30 = (long)local_1b4;
        local_28 = &local_190;
        *(float *)((long)local_190 + local_30 * 4) = fVar5;
      }
      lVar3 = *local_118;
      iVar2 = *(int *)((long)local_118 + 0x2c);
      lVar4 = local_118[2];
      for (local_1e4 = 0; local_1e4 < local_144; local_1e4 = local_1e4 + 1) {
        local_40 = (long)local_1e4;
        local_38 = &local_190;
        uVar1 = *(undefined4 *)((long)local_190 + local_40 * 4);
        local_50 = (long)local_1e4;
        *(undefined4 *)(*in_stack_00000008 + local_50 * 4) = uVar1;
        *(undefined4 *)(lVar3 + (long)iVar2 * (long)iVar6 * lVar4 + (long)local_1e4 * 4) = uVar1;
      }
      local_94 = iVar6;
    }
    local_104 = 0;
  }
  else {
    local_104 = -100;
  }
  local_100 = &local_190;
  if (local_188 != (int *)0x0) {
    local_74 = 0xffffffff;
    LOCK();
    local_78 = *local_188;
    *local_188 = *local_188 + -1;
    UNLOCK();
    if (local_78 == 1) {
      local_70 = local_100;
      if (local_170 == (long *)0x0) {
        local_68 = local_190;
        if (local_190 != (void *)0x0) {
          free(local_190);
        }
      }
      else {
        (**(code **)(*local_170 + 0x18))(local_170,local_190);
      }
    }
  }
  return local_104;
}

Assistant:

static int rnn(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, Mat& hidden_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // num_output
    Mat gates(num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // unroll
    for (int t = 0; t < T; t++)
    {
        int ti = reverse ? T - 1 - t : t;

        const float* x = bottom_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            const float* weight_xc_ptr = weight_xc.row(q);
            const float* weight_hc_ptr = weight_hc.row(q);

            float H = bias_c[q];

            for (int i = 0; i < size; i++)
            {
                H += weight_xc_ptr[i] * x[i];
            }

            for (int i = 0; i < num_output; i++)
            {
                H += weight_hc_ptr[i] * hidden_state[i];
            }

            H = tanhf(H);

            gates[q] = H;
        }

        float* output_data = top_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            float H = gates[q];

            hidden_state[q] = H;
            output_data[q] = H;
        }
    }

    return 0;
}